

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

void __thiscall TokenPattern::TokenPattern(TokenPattern *this,TokenPattern *tokpat)

{
  int iVar1;
  undefined4 extraout_var;
  TokenPattern *tokpat_local;
  TokenPattern *this_local;
  
  std::vector<Token_*,_std::allocator<Token_*>_>::vector(&this->toklist);
  iVar1 = (*tokpat->pattern->_vptr_Pattern[2])();
  this->pattern = (Pattern *)CONCAT44(extraout_var,iVar1);
  std::vector<Token_*,_std::allocator<Token_*>_>::operator=(&this->toklist,&tokpat->toklist);
  this->leftellipsis = (bool)(tokpat->leftellipsis & 1);
  this->rightellipsis = (bool)(tokpat->rightellipsis & 1);
  return;
}

Assistant:

TokenPattern::TokenPattern(const TokenPattern &tokpat)

{
  pattern = tokpat.pattern->simplifyClone();
  toklist = tokpat.toklist;
  leftellipsis = tokpat.leftellipsis;
  rightellipsis = tokpat.rightellipsis;
}